

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreateSharedResourcesTest<vkt::api::(anonymous_namespace)::ShaderModule>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  TestStatus *pTVar1;
  deUint32 dVar2;
  const_iterator cVar3;
  ThreadGroupThread *this;
  uint uVar4;
  uint uVar5;
  Resources res;
  ThreadGroup threads;
  Environment env;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_b8;
  TestStatus *local_a8;
  undefined8 local_a0;
  ThreadGroup local_98;
  PlatformInterface *local_68;
  DeviceInterface *local_60;
  VkDevice local_58;
  deUint32 local_50;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *local_48;
  undefined8 local_40;
  uint local_38;
  
  local_a8 = __return_storage_ptr__;
  dVar2 = deGetNumAvailableLogicalCores();
  uVar4 = 8;
  if (dVar2 < 8) {
    uVar4 = dVar2;
  }
  uVar5 = 2;
  if (2 < uVar4) {
    uVar5 = uVar4;
  }
  local_68 = context->m_platformInterface;
  local_60 = Context::getDeviceInterface(context);
  local_58 = Context::getDevice(context);
  local_50 = Context::getUniversalQueueFamilyIndex(context);
  local_48 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)context->m_progCollection;
  local_40 = 0;
  local_38 = uVar5;
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(local_48,&params->binaryName);
  local_a0 = *(undefined8 *)(cVar3._M_node + 2);
  ThreadGroup::ThreadGroup(&local_98);
  do {
    this = (ThreadGroupThread *)operator_new(0x88);
    ThreadGroupThread::ThreadGroupThread(this);
    (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00cee838;
    this[1].super_Thread._vptr_Thread = (_func_int **)&local_68;
    *(undefined8 **)&this[1].super_Thread.m_attribs = &local_a0;
    this[1].super_Thread.m_thread = (deThread)params;
    local_b8.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this;
    ThreadGroup::add(&local_98,&local_b8);
    if (local_b8.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_b8.
          super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_b8.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    pTVar1 = local_a8;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
  ThreadGroup::run(local_a8,&local_98);
  de::SpinBarrier::~SpinBarrier(&local_98.m_barrier);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
  ::~vector(&local_98.m_threads);
  return pTVar1;
}

Assistant:

tcu::TestStatus multithreadedCreateSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const deUint32						numThreads	= getDefaultTestThreadCount();
	const Environment					env			(context, numThreads);
	const typename Object::Resources	res			(env, params);
	ThreadGroup							threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, res, params)));

	return threads.run();
}